

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

string * __thiscall
hedg::Lay::instruction
          (string *__return_storage_ptr__,Lay *this,string *market_id,
          vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  string_view fmt;
  format_args args;
  string_view fmt_00;
  string_view fmt_01;
  format_args args_00;
  string_view fmt_02;
  string_view fmt_03;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_600 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  undefined1 local_5e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  float local_5d4;
  float *local_5d0;
  size_t local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  float local_5b0;
  float local_5ac;
  char *local_5a8;
  size_t local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_590;
  float local_584;
  float *local_580;
  size_t local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  float local_560;
  float local_55c;
  char *local_558;
  size_t local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  int local_52c;
  undefined1 local_528 [4];
  int i;
  string instructions;
  vector<hedg::Order,_std::allocator<hedg::Order>_> *orders_local;
  string *market_id_local;
  Lay *this_local;
  string *body;
  format_args local_4b8;
  char *local_4a8;
  size_t local_4a0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  float *local_490;
  float *local_488;
  reference local_480;
  char *local_478;
  size_t sStack_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float,_float>
  local_458;
  undefined1 local_428 [16];
  char *local_418;
  size_t local_410;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  float *local_400;
  float *local_3f8;
  reference local_3f0;
  char *local_3e8;
  size_t sStack_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  char *local_3c8;
  char **local_3c0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float> local_3b8;
  format_args local_390;
  float *local_380;
  size_t local_378;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  float *local_368;
  reference local_360;
  float *local_358;
  size_t sStack_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float> local_338;
  undefined1 local_310 [16];
  float *local_300;
  size_t local_2f8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  float *local_2e8;
  reference local_2e0;
  float *local_2d8;
  size_t sStack_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  char *local_2b8;
  float **local_2b0;
  char *local_2a8;
  char **local_2a0;
  char *local_298;
  float **local_290;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  format_args local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  size_t local_250;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  string *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  size_t sStack_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  char *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_208;
  char **local_200;
  char *local_1f8;
  size_t sStack_1f0;
  char **local_1e0;
  char *local_1d8;
  size_t sStack_1d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_1c8;
  undefined1 *local_1c0;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_1b8;
  format_args *local_1b0;
  char *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1a0;
  char *local_198;
  float **local_190;
  char *local_188;
  char **local_180;
  char *local_178;
  float **local_170;
  char *local_168;
  char **local_160;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_158;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_150;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_148;
  undefined8 local_140;
  format_args *local_138;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_130;
  undefined8 local_128;
  undefined1 *local_120;
  char *local_118;
  float **local_110;
  float *local_108;
  size_t sStack_100;
  float **local_f0;
  float *local_e8;
  size_t sStack_e0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_d8;
  undefined1 *local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float> *local_b0;
  format_args *local_a8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float> *local_a0;
  undefined8 local_98;
  format_args *local_90;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float> *local_88;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  format_args *local_38;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  undefined8 local_28;
  format_args *local_20;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  char *local_10;
  
  instructions.field_2._8_8_ = orders;
  std::__cxx11::string::string((string *)local_528);
  bVar2 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::empty
                    ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)instructions.field_2._8_8_
                    );
  if (!bVar2) {
    for (local_52c = 0; uVar3 = (ulong)local_52c,
        sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                          ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                           instructions.field_2._8_8_), uVar1 = instructions.field_2._8_8_,
        uVar3 < sVar4 - 1; local_52c = local_52c + 1) {
      pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                         ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                          instructions.field_2._8_8_,(long)local_52c);
      if (pvVar5->order_type == LIMIT) {
        local_538 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::back_inserter<std::__cxx11::string>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_528);
        local_3c0 = &local_558;
        local_3c8 = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
        ;
        local_168 = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
        ;
        local_558 = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
        ;
        local_160 = local_3c0;
        local_550 = strlen(
                          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
                          );
        local_118 = local_3c8;
        pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                            instructions.field_2._8_8_,(long)local_52c);
        pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                            instructions.field_2._8_8_,(long)local_52c);
        local_55c = Bid::get_size(&pvVar6->bid);
        pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                            instructions.field_2._8_8_,(long)local_52c);
        local_560 = Bid::get_price(&pvVar6->bid);
        local_3d8 = local_538;
        local_3e8 = local_558;
        sStack_3e0 = local_550;
        local_3f8 = &local_55c;
        local_400 = &local_560;
        local_408.container = local_538;
        local_200 = &local_3e8;
        local_418 = local_558;
        local_410 = local_550;
        local_3f0 = pvVar5;
        local_1f8 = local_418;
        sStack_1f0 = local_410;
        ::fmt::v8::
        make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&,float&,float&>
                  (&local_458,(v8 *)pvVar5,(int *)local_3f8,local_400,(float *)in_R8.values_);
        local_1c0 = local_428;
        in_R8.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_458
        ;
        local_128 = 0x991;
        fmt_00.size_ = local_410;
        fmt_00.data_ = local_418;
        args.field_1.values_ = in_R8.values_;
        args.desc_ = 0x991;
        local_1c8.values_ = in_R8.values_;
        local_150.values_ = in_R8.values_;
        local_130.values_ = in_R8.values_;
        local_120 = local_1c0;
        local_568 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::fmt::v8::
                    vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                              (local_408,fmt_00,args);
        local_3d0 = local_568;
      }
      else {
        pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                            instructions.field_2._8_8_,(long)local_52c);
        if (pvVar5->order_type == SP) {
          local_570 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::back_inserter<std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_528);
          local_2b0 = &local_580;
          local_2b8 = 
          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}},"
          ;
          local_178 = 
          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}},"
          ;
          local_580 = (float *)0x3887f0;
          local_170 = local_2b0;
          local_578 = strlen(
                            "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}},"
                            );
          local_78 = local_2b8;
          pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                             ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                              instructions.field_2._8_8_,(long)local_52c);
          pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                             ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                              instructions.field_2._8_8_,(long)local_52c);
          local_584 = Bid::get_size(&pvVar6->bid);
          local_2c8 = local_570;
          local_2d8 = local_580;
          sStack_2d0 = local_578;
          local_2e8 = &local_584;
          local_2f0.container = local_570;
          local_110 = &local_2d8;
          local_300 = local_580;
          local_2f8 = local_578;
          local_2e0 = pvVar5;
          local_108 = local_300;
          sStack_100 = local_2f8;
          ::fmt::v8::
          make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&,float&>
                    (&local_338,(v8 *)pvVar5,(int *)local_2e8,local_580);
          local_d0 = local_310;
          in_R8.values_ =
               (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_338;
          local_c0 = 0x91;
          fmt_02.size_ = local_2f8;
          fmt_02.data_ = (char *)local_300;
          args_00.field_1.values_ = in_R8.values_;
          args_00.desc_ = 0x91;
          local_d8.values_ = in_R8.values_;
          local_c8.values_ = in_R8.values_;
          local_b8 = local_d0;
          local_80.values_ = in_R8.values_;
          local_590 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ::fmt::v8::
                      vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                                (local_2f0,fmt_02,args_00);
          local_2c0 = local_590;
        }
      }
    }
    sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                      ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                       instructions.field_2._8_8_);
    pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                       ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
    uVar1 = instructions.field_2._8_8_;
    if (pvVar5->order_type == LIMIT) {
      local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::back_inserter<std::__cxx11::string>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_528);
      local_2a0 = &local_5a8;
      local_2a8 = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
      ;
      local_188 = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
      ;
      local_5a8 = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
      ;
      local_180 = local_2a0;
      local_5a0 = strlen(
                        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
                        );
      uVar1 = instructions.field_2._8_8_;
      local_70 = local_2a8;
      sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                        ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                         instructions.field_2._8_8_);
      pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                         ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
      uVar1 = instructions.field_2._8_8_;
      sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                        ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                         instructions.field_2._8_8_);
      pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                         ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
      local_5ac = Bid::get_size(&pvVar6->bid);
      uVar1 = instructions.field_2._8_8_;
      sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                        ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                         instructions.field_2._8_8_);
      pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                         ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
      local_5b0 = Bid::get_price(&pvVar6->bid);
      local_468 = local_598;
      local_478 = local_5a8;
      sStack_470 = local_5a0;
      local_488 = &local_5ac;
      local_490 = &local_5b0;
      local_498.container = local_598;
      local_1e0 = &local_478;
      local_4a8 = local_5a8;
      local_4a0 = local_5a0;
      local_480 = pvVar5;
      local_1d8 = local_4a8;
      sStack_1d0 = local_4a0;
      ::fmt::v8::
      make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&,float&,float&>
                ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int,_float,_float>
                  *)&body,(v8 *)pvVar5,(int *)local_488,local_490,(float *)in_R8.values_);
      local_1b0 = &local_4b8;
      local_1b8 = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&body;
      local_140 = 0x991;
      local_4b8.desc_ = 0x991;
      local_4b8.field_1.values_ = local_1b8;
      fmt.size_ = local_4a0;
      fmt.data_ = local_4a8;
      local_158 = local_1b8;
      local_148 = local_1b8;
      local_138 = local_1b0;
      local_5b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::fmt::v8::
                  vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                            (local_498,fmt,local_4b8);
      local_460 = local_5b8;
    }
    else {
      sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                        ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                         instructions.field_2._8_8_);
      pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                         ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
      if (pvVar5->order_type == SP) {
        local_5c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::back_inserter<std::__cxx11::string>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_528);
        local_290 = &local_5d0;
        local_298 = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}}"
        ;
        local_198 = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}}"
        ;
        local_5d0 = (float *)0x388905;
        local_190 = local_290;
        local_5c8 = strlen(
                          "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}}"
                          );
        uVar1 = instructions.field_2._8_8_;
        local_68 = local_298;
        sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                          ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                           instructions.field_2._8_8_);
        pvVar5 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
        uVar1 = instructions.field_2._8_8_;
        sVar4 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::size
                          ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                           instructions.field_2._8_8_);
        pvVar6 = std::vector<hedg::Order,_std::allocator<hedg::Order>_>::operator[]
                           ((vector<hedg::Order,_std::allocator<hedg::Order>_> *)uVar1,sVar4 - 1);
        local_5d4 = Bid::get_size(&pvVar6->bid);
        local_348 = local_5c0;
        local_358 = local_5d0;
        sStack_350 = local_5c8;
        local_368 = &local_5d4;
        local_370.container = local_5c0;
        local_f0 = &local_358;
        local_380 = local_5d0;
        local_378 = local_5c8;
        local_360 = pvVar5;
        local_e8 = local_380;
        sStack_e0 = local_378;
        ::fmt::v8::
        make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&,float&>
                  (&local_3b8,(v8 *)pvVar5,(int *)local_368,local_5d0);
        local_a8 = &local_390;
        local_b0 = &local_3b8;
        local_98 = 0x91;
        local_390.desc_ = 0x91;
        local_390.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_b0;
        fmt_01.size_ = local_378;
        fmt_01.data_ = (char *)local_380;
        local_a0 = local_b0;
        local_90 = local_a8;
        local_88 = local_b0;
        local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::fmt::v8::
                    vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                              (local_370,fmt_01,local_390);
        local_340 = local_5e0;
      }
    }
  }
  local_5e1 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_5f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  local_208 = local_600;
  local_210 = 
  "[{{\"jsonrpc\": \"2.0\",\"method\": \"SportsAPING/v1.0/placeOrders\",\"params\": {{\"marketId\": \"{}\",\"instructions\": [{}]}},\"id\": 1}}]"
  ;
  local_1a8 = 
  "[{{\"jsonrpc\": \"2.0\",\"method\": \"SportsAPING/v1.0/placeOrders\",\"params\": {{\"marketId\": \"{}\",\"instructions\": [{}]}},\"id\": 1}}]"
  ;
  local_600[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x388986;
  local_1a0 = local_208;
  local_250 = strlen(
                    "[{{\"jsonrpc\": \"2.0\",\"method\": \"SportsAPING/v1.0/placeOrders\",\"params\": {{\"marketId\": \"{}\",\"instructions\": [{}]}},\"id\": 1}}]"
                    );
  local_10 = local_210;
  local_220 = local_5f0;
  local_230 = local_600[0];
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528;
  local_248.container = local_5f0;
  local_60 = &local_230;
  local_258 = local_600[0];
  local_238 = market_id;
  sStack_228 = local_250;
  local_58 = local_258;
  sStack_50 = local_250;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
            (&local_288,(v8 *)market_id,local_240,local_600[0]);
  local_38 = &local_268;
  local_40 = &local_288;
  local_28 = 0xdd;
  local_268.desc_ = 0xdd;
  local_268.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_40;
  fmt_03.size_ = local_250;
  fmt_03.data_ = (char *)local_258;
  local_30 = local_40;
  local_20 = local_38;
  local_18 = local_40;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::fmt::v8::
              vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                        (local_248,fmt_03,local_268);
  local_5e1 = 1;
  std::__cxx11::string::~string((string *)local_528);
  return __return_storage_ptr__;
}

Assistant:

std::string Lay::instruction(std::string market_id, std::vector<Order>& orders) {

	std::string instructions;

	if (!orders.empty()) {
		for (int i = 0; i < orders.size() - 1; ++i) {

			if (orders[i].order_type == LIMIT) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"LIMIT\","
					"\"limitOrder\": {{"
					"\"size\": \"{}\","
					"\"price\": \"{}\","
					"\"persistenceType\": \"LAPSE\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size(), orders[i].bid.get_price());
			}
			else if (orders[i].order_type == SP) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"MARKET_ON_CLOSE\","
					"\"marketOnCloseOrder\": {{"
					"\"liability\": \"{}\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size());
			}
		}
		if (orders[orders.size() - 1].order_type == LIMIT) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"LIMIT\","
				"\"limitOrder\": {{"
				"\"size\": \"{}\","
				"\"price\": \"{}\","
				"\"persistenceType\": \"LAPSE\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size(), orders[orders.size() - 1].bid.get_price());
		}
		else if (orders[orders.size() - 1].order_type == SP) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"MARKET_ON_CLOSE\","
				"\"marketOnCloseOrder\": {{"
				"\"liability\": \"{}\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size());
		}

	}
	std::string body;

	fmt::format_to(std::back_inserter(body),"["
		"{{"
		"\"jsonrpc\": \"2.0\","
		"\"method\": \"SportsAPING/v1.0/placeOrders\","
		"\"params\": {{"
		"\"marketId\": \"{}\","
		"\"instructions\": ["
		"{}"
		"]"
		"}},"
		"\"id\": 1"
		"}}"
		"]", market_id, instructions);
	
	return body;
}